

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O2

int pkcs12_pbe_decrypt_init
              (pbe_suite *suite,EVP_CIPHER_CTX *ctx,char *pass,size_t pass_len,CBS *param)

{
  int iVar1;
  int line;
  uint64_t iterations;
  CBS pbe_param;
  CBS salt;
  
  iVar1 = CBS_get_asn1(param,&pbe_param,0x20000010);
  if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1(&pbe_param,&salt,4), iVar1 == 0)) ||
      (iVar1 = CBS_get_asn1_uint64(&pbe_param,&iterations), iVar1 == 0)) ||
     ((pbe_param.len != 0 || (param->len != 0)))) {
    iVar1 = 0x68;
    line = 0xdc;
  }
  else {
    iVar1 = pkcs12_iterations_acceptable(CONCAT44(iterations._4_4_,(uint32_t)iterations));
    if (iVar1 != 0) {
      iVar1 = pkcs12_pbe_cipher_init
                        (suite,ctx,(uint32_t)iterations,pass,pass_len,salt.data,salt.len,0);
      return iVar1;
    }
    iVar1 = 0x81;
    line = 0xe1;
  }
  ERR_put_error(0x13,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                ,line);
  return 0;
}

Assistant:

static int pkcs12_pbe_decrypt_init(const struct pbe_suite *suite,
                                   EVP_CIPHER_CTX *ctx, const char *pass,
                                   size_t pass_len, CBS *param) {
  CBS pbe_param, salt;
  uint64_t iterations;
  if (!CBS_get_asn1(param, &pbe_param, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pbe_param, &salt, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1_uint64(&pbe_param, &iterations) ||
      CBS_len(&pbe_param) != 0 || CBS_len(param) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  if (!pkcs12_iterations_acceptable(iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  return pkcs12_pbe_cipher_init(suite, ctx, (uint32_t)iterations, pass,
                                pass_len, CBS_data(&salt), CBS_len(&salt),
                                0 /* decrypt */);
}